

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

int fe_process_frames_ext
              (fe_t *fe,int16 **inout_spch,size_t *inout_nsamps,mfcc_t **buf_cep,
              int32 *inout_nframes,int16 *voiced_spch,int32 *voiced_spch_nsamps,int32 *out_frameidx)

{
  short sVar1;
  int16 *__src;
  size_t sVar2;
  int32 iVar3;
  int iVar4;
  bool bVar5;
  int offset;
  size_t orig_nsamps;
  int16 *orig_spch;
  int local_48;
  int orig_n_overflow;
  int n_overflow;
  int outidx;
  int16 *voiced_spch_local;
  int32 *inout_nframes_local;
  mfcc_t **buf_cep_local;
  size_t *inout_nsamps_local;
  int16 **inout_spch_local;
  fe_t *fe_local;
  
  if (buf_cep == (mfcc_t **)0x0) {
    if (*inout_nsamps + (long)fe->num_overflow_samps < (ulong)(long)fe->frame_size) {
      *inout_nframes = 0;
    }
    else {
      *inout_nframes =
           (int)(((*inout_nsamps + (long)fe->num_overflow_samps) - (long)fe->frame_size) /
                (ulong)(long)fe->frame_shift) + 1;
    }
    if (fe->vad_data->in_speech == '\0') {
      iVar3 = fe_prespch_ncep(fe->vad_data->prespch_buf);
      *inout_nframes = iVar3 + *inout_nframes;
    }
    fe_local._4_4_ = *inout_nframes;
  }
  else {
    if (out_frameidx != (int32 *)0x0) {
      *out_frameidx = 0;
    }
    if (*inout_nsamps + (long)fe->num_overflow_samps < (ulong)(long)fe->frame_size) {
      if (*inout_nsamps != 0) {
        memcpy(fe->overflow_samps + (int)fe->num_overflow_samps,*inout_spch,*inout_nsamps << 1);
        fe->num_overflow_samps = fe->num_overflow_samps + (short)*inout_nsamps;
        fe->num_processed_samps = *inout_nsamps + fe->num_processed_samps;
        *inout_spch = *inout_spch + *inout_nsamps;
        *inout_nsamps = 0;
      }
      *inout_nframes = 0;
      fe_local._4_4_ = 0;
    }
    else if (*inout_nframes < 1) {
      *inout_nframes = 0;
      fe_local._4_4_ = 0;
    }
    else {
      orig_n_overflow = 0;
      if (((fe->vad_data->in_speech == '\0') ||
          (iVar3 = fe_prespch_ncep(fe->vad_data->prespch_buf), iVar3 < 1)) ||
         (orig_n_overflow = fe_copy_from_prespch(fe,inout_nframes,buf_cep,0), 0 < *inout_nframes)) {
        __src = *inout_spch;
        sVar2 = *inout_nsamps;
        sVar1 = fe->num_overflow_samps;
        if (fe->num_overflow_samps < 1) {
          fe_read_frame(fe,*inout_spch,(int)fe->frame_size);
          *inout_spch = *inout_spch + (int)fe->frame_size;
          *inout_nsamps = *inout_nsamps - (long)fe->frame_size;
        }
        else {
          iVar4 = (int)fe->frame_size - (int)fe->num_overflow_samps;
          memcpy(fe->overflow_samps + (int)fe->num_overflow_samps,*inout_spch,(long)iVar4 << 1);
          fe_read_frame(fe,fe->overflow_samps,(int)fe->frame_size);
          *inout_spch = *inout_spch + iVar4;
          *inout_nsamps = *inout_nsamps - (long)iVar4;
        }
        fe_write_frame(fe,buf_cep[orig_n_overflow],(uint)(voiced_spch != (int16 *)0x0));
        iVar4 = (int)sVar2;
        orig_n_overflow =
             fe_check_prespeech(fe,inout_nframes,buf_cep,orig_n_overflow,out_frameidx,inout_nsamps,
                                iVar4);
        while( true ) {
          bVar5 = false;
          if (0 < *inout_nframes) {
            bVar5 = (ulong)(long)fe->frame_shift <= *inout_nsamps;
          }
          if (!bVar5) break;
          fe_shift_frame(fe,*inout_spch,(int)fe->frame_shift);
          fe_write_frame(fe,buf_cep[orig_n_overflow],(uint)(voiced_spch != (int16 *)0x0));
          orig_n_overflow =
               fe_check_prespeech(fe,inout_nframes,buf_cep,orig_n_overflow,out_frameidx,inout_nsamps
                                  ,iVar4);
          *inout_spch = *inout_spch + (int)fe->frame_shift;
          *inout_nsamps = *inout_nsamps - (long)fe->frame_shift;
        }
        if (fe->num_overflow_samps < 1) {
          local_48 = (int)*inout_nsamps;
          if (fe->frame_shift < local_48) {
            local_48 = (int)fe->frame_shift;
          }
          fe->num_overflow_samps = fe->frame_size - fe->frame_shift;
          if ((long)*inout_spch - (long)__src >> 1 < (long)fe->num_overflow_samps) {
            fe->num_overflow_samps = (int16)((long)*inout_spch - (long)__src >> 1);
          }
          fe->num_overflow_samps = fe->num_overflow_samps + (short)local_48;
          if (0 < fe->num_overflow_samps) {
            memcpy(fe->overflow_samps,
                   *inout_spch + -(long)((int)fe->frame_size - (int)fe->frame_shift),
                   (long)fe->num_overflow_samps << 1);
            *inout_spch = *inout_spch + local_48;
            *inout_nsamps = *inout_nsamps - (long)local_48;
          }
        }
        else {
          memmove(fe->overflow_samps,
                  fe->overflow_samps + ((long)(int)sVar1 - (long)(int)fe->num_overflow_samps),
                  (long)fe->num_overflow_samps << 1);
          local_48 = (int)((long)*inout_spch - (long)__src >> 1) + (int)*inout_nsamps;
          if ((int)fe->frame_size - (int)fe->num_overflow_samps < local_48) {
            local_48 = (int)fe->frame_size - (int)fe->num_overflow_samps;
          }
          memcpy(fe->overflow_samps + (int)fe->num_overflow_samps,__src,(long)local_48 << 1);
          fe->num_overflow_samps = fe->num_overflow_samps + (short)local_48;
          if ((long)*inout_spch - (long)__src >> 1 < (long)local_48) {
            local_48 = local_48 - (int)((long)*inout_spch - (long)__src >> 1);
            *inout_spch = *inout_spch + local_48;
            *inout_nsamps = *inout_nsamps - (long)local_48;
          }
        }
        *inout_nframes = orig_n_overflow;
        fe->num_processed_samps = (sVar2 - *inout_nsamps) + fe->num_processed_samps;
        fe_local._4_4_ = 0;
      }
      else {
        *inout_nframes = orig_n_overflow;
        fe_local._4_4_ = 0;
      }
    }
  }
  return fe_local._4_4_;
}

Assistant:

int 
fe_process_frames_ext(fe_t *fe,
                  int16 const **inout_spch,
                  size_t *inout_nsamps,
                  mfcc_t **buf_cep,
                  int32 *inout_nframes,
                  int16 *voiced_spch,
                  int32 *voiced_spch_nsamps,
                  int32 *out_frameidx)
{
    int outidx, n_overflow, orig_n_overflow;
    int16 const *orig_spch;
    size_t orig_nsamps;
    
    /* The logic here is pretty complex, please be careful with modifications */

    /* FIXME: Dump PCM data if needed */

    /* In the special case where there is no output buffer, return the
     * maximum number of frames which would be generated. */
    if (buf_cep == NULL) {
        if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size)
            *inout_nframes = 0;
        else 
            *inout_nframes = 1
                + ((*inout_nsamps + fe->num_overflow_samps - fe->frame_size)
                   / fe->frame_shift);
        if (!fe->vad_data->in_speech)
            *inout_nframes += fe_prespch_ncep(fe->vad_data->prespch_buf);
        return *inout_nframes;
    }

    if (out_frameidx)
        *out_frameidx = 0;

    /* Are there not enough samples to make at least 1 frame? */
    if (*inout_nsamps + fe->num_overflow_samps < (size_t)fe->frame_size) {
        if (*inout_nsamps > 0) {
            /* Append them to the overflow buffer. */
            memcpy(fe->overflow_samps + fe->num_overflow_samps,
                   *inout_spch, *inout_nsamps * (sizeof(int16)));
            fe->num_overflow_samps += *inout_nsamps;
	    fe->num_processed_samps += *inout_nsamps;
            *inout_spch += *inout_nsamps;
            *inout_nsamps = 0;
        }
        /* We produced no frames of output, sorry! */
        *inout_nframes = 0;
        return 0;
    }

    /* Can't write a frame?  Then do nothing! */
    if (*inout_nframes < 1) {
        *inout_nframes = 0;
        return 0;
    }

    /* Index of output frame. */
    outidx = 0;

    /* Try to read from prespeech buffer */
    if (fe->vad_data->in_speech && fe_prespch_ncep(fe->vad_data->prespch_buf) > 0) {
    	outidx = fe_copy_from_prespch(fe, inout_nframes, buf_cep, outidx);
        if ((*inout_nframes) < 1) {
            /* mfcc buffer is filled from prespeech buffer */
            *inout_nframes = outidx;
            return 0;
        }
    }

    /* Keep track of the original start of the buffer. */
    orig_spch = *inout_spch;
    orig_nsamps = *inout_nsamps;
    orig_n_overflow = fe->num_overflow_samps;

    /* Start processing, taking care of any incoming overflow. */
    if (fe->num_overflow_samps > 0) {
        int offset = fe->frame_size - fe->num_overflow_samps;
        /* Append start of spch to overflow samples to make a full frame. */
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               *inout_spch, offset * sizeof(**inout_spch));
        fe_read_frame(fe, fe->overflow_samps, fe->frame_size);
        /* Update input-output pointers and counters. */
        *inout_spch += offset;
        *inout_nsamps -= offset;
    } else {
        fe_read_frame(fe, *inout_spch, fe->frame_size);
        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_size;
        *inout_nsamps -= fe->frame_size;
    }

    fe_write_frame(fe, buf_cep[outidx], voiced_spch != NULL);
    outidx = fe_check_prespeech(fe, inout_nframes, buf_cep, outidx, out_frameidx, inout_nsamps, orig_nsamps);

    /* Process all remaining frames. */
    while (*inout_nframes > 0 && *inout_nsamps >= (size_t)fe->frame_shift) {
        fe_shift_frame(fe, *inout_spch, fe->frame_shift);
        fe_write_frame(fe, buf_cep[outidx], voiced_spch != NULL);

	outidx = fe_check_prespeech(fe, inout_nframes, buf_cep, outidx, out_frameidx, inout_nsamps, orig_nsamps);

        /* Update input-output pointers and counters. */
        *inout_spch += fe->frame_shift;
        *inout_nsamps -= fe->frame_shift;
    }

    /* How many relevant overflow samples are there left? */
    if (fe->num_overflow_samps <= 0) {
        /* Maximum number of overflow samples past *inout_spch to save. */
        n_overflow = *inout_nsamps;
        if (n_overflow > fe->frame_shift)
            n_overflow = fe->frame_shift;
        fe->num_overflow_samps = fe->frame_size - fe->frame_shift;
        /* Make sure this isn't an illegal read! */
        if (fe->num_overflow_samps > *inout_spch - orig_spch)
            fe->num_overflow_samps = *inout_spch - orig_spch;
        fe->num_overflow_samps += n_overflow;
        if (fe->num_overflow_samps > 0) {
            memcpy(fe->overflow_samps,
                   *inout_spch - (fe->frame_size - fe->frame_shift),
                   fe->num_overflow_samps * sizeof(**inout_spch));
            /* Update the input pointer to cover this stuff. */
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    } else {
        /* There is still some relevant data left in the overflow buffer. */
        /* Shift existing data to the beginning. */
        memmove(fe->overflow_samps,
                fe->overflow_samps + orig_n_overflow - fe->num_overflow_samps,
                fe->num_overflow_samps * sizeof(*fe->overflow_samps));
        /* Copy in whatever we had in the original speech buffer. */
        n_overflow = *inout_spch - orig_spch + *inout_nsamps;
        if (n_overflow > fe->frame_size - fe->num_overflow_samps)
            n_overflow = fe->frame_size - fe->num_overflow_samps;
        memcpy(fe->overflow_samps + fe->num_overflow_samps,
               orig_spch, n_overflow * sizeof(*orig_spch));
        fe->num_overflow_samps += n_overflow;
        /* Advance the input pointers. */
        if (n_overflow > *inout_spch - orig_spch) {
            n_overflow -= (*inout_spch - orig_spch);
            *inout_spch += n_overflow;
            *inout_nsamps -= n_overflow;
        }
    }

    /* Finally update the frame counter with the number of frames
     * and global sample counter with number of samples we procesed */
    *inout_nframes = outidx; /* FIXME: Not sure why I wrote it this way... */
    fe->num_processed_samps += orig_nsamps - *inout_nsamps;

    return 0;
}